

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMvIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  float fVar2;
  float fVar3;
  BVH *bvh;
  NodeRef root;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  size_t k;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined8 uVar29;
  undefined8 uVar30;
  uint uVar31;
  int iVar32;
  long lVar33;
  undefined4 uVar34;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  uint uVar39;
  long lVar40;
  NodeRef *pNVar41;
  bool bVar42;
  float fVar43;
  vint4 ai_2;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar63;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar60;
  float fVar61;
  float fVar62;
  undefined1 in_ZMM0 [64];
  float fVar64;
  vint4 bi;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  vint4 bi_1;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  vint4 bi_3;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  vint4 bi_2;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar96;
  float fVar103;
  float fVar104;
  vint4 ai;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar105;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar110;
  undefined1 auVar109 [16];
  float fVar111;
  float fVar119;
  float fVar121;
  vint4 ai_1;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar112;
  float fVar120;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar125;
  float fVar126;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar127 [16];
  vint4 ai_3;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar138;
  undefined1 auVar137 [64];
  uint uVar139;
  float fVar140;
  uint uVar142;
  float fVar143;
  uint uVar144;
  float fVar145;
  uint uVar146;
  float fVar147;
  undefined1 in_ZMM11 [64];
  undefined1 auVar141 [64];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar148;
  undefined1 auVar149 [16];
  undefined1 auVar150 [64];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar157;
  float fVar161;
  float fVar162;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar163;
  Precalculations pre;
  float local_19c8;
  float fStack_19c4;
  float fStack_19c0;
  float fStack_19bc;
  undefined1 local_19a8 [16];
  RayK<4> *local_1990;
  undefined1 local_1988 [8];
  float fStack_1980;
  float fStack_197c;
  vbool<4> terminated;
  RTCFilterFunctionNArguments args;
  undefined1 local_1928 [16];
  undefined1 local_1918 [16];
  undefined1 local_1908 [8];
  float fStack_1900;
  float fStack_18fc;
  undefined8 local_18c8;
  undefined8 uStack_18c0;
  RTCHitN local_18b8 [16];
  undefined1 local_18a8 [16];
  undefined1 local_1898 [16];
  undefined1 local_1888 [16];
  undefined1 local_1878 [16];
  undefined1 local_1868 [16];
  undefined1 local_1858 [16];
  uint local_1848;
  uint uStack_1844;
  uint uStack_1840;
  uint uStack_183c;
  uint uStack_1838;
  uint uStack_1834;
  uint uStack_1830;
  uint uStack_182c;
  TravRayK<4,_false> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  auVar6 = mm_lookupmask_ps._240_16_;
  uVar30 = mm_lookupmask_ps._8_8_;
  uVar29 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar87 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar50 = vpcmpeqd_avx(auVar87,(undefined1  [16])valid_i->field_0);
    auVar118 = ZEXT816(0) << 0x40;
    auVar76 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar118,5);
    auVar93 = auVar50 & auVar76;
    if ((((auVar93 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar93 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar93 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar93[0xf] < '\0')
    {
      auVar76 = vandps_avx(auVar76,auVar50);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar132._8_4_ = 0x7fffffff;
      auVar132._0_8_ = 0x7fffffff7fffffff;
      auVar132._12_4_ = 0x7fffffff;
      auVar50 = vandps_avx(auVar132,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar113._8_4_ = 0x219392ef;
      auVar113._0_8_ = 0x219392ef219392ef;
      auVar113._12_4_ = 0x219392ef;
      auVar50 = vcmpps_avx(auVar50,auVar113,1);
      auVar93 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar113,auVar50)
      ;
      auVar50 = vandps_avx(auVar132,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar50 = vcmpps_avx(auVar50,auVar113,1);
      auVar59 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar113,auVar50)
      ;
      auVar50 = vandps_avx(auVar132,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar50 = vcmpps_avx(auVar50,auVar113,1);
      auVar50 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar113,auVar50)
      ;
      auVar92 = vrcpps_avx(auVar93);
      fVar61 = auVar92._0_4_;
      auVar88._0_4_ = auVar93._0_4_ * fVar61;
      fVar62 = auVar92._4_4_;
      auVar88._4_4_ = auVar93._4_4_ * fVar62;
      fVar63 = auVar92._8_4_;
      auVar88._8_4_ = auVar93._8_4_ * fVar63;
      fVar110 = auVar92._12_4_;
      auVar88._12_4_ = auVar93._12_4_ * fVar110;
      auVar114._8_4_ = 0x3f800000;
      auVar114._0_8_ = &DAT_3f8000003f800000;
      auVar114._12_4_ = 0x3f800000;
      auVar93 = vsubps_avx(auVar114,auVar88);
      tray.rdir.field_0._0_4_ = fVar61 + fVar61 * auVar93._0_4_;
      tray.rdir.field_0._4_4_ = fVar62 + fVar62 * auVar93._4_4_;
      tray.rdir.field_0._8_4_ = fVar63 + fVar63 * auVar93._8_4_;
      tray.rdir.field_0._12_4_ = fVar110 + fVar110 * auVar93._12_4_;
      auVar93 = vrcpps_avx(auVar59);
      fVar61 = auVar93._0_4_;
      auVar92._0_4_ = auVar59._0_4_ * fVar61;
      fVar62 = auVar93._4_4_;
      auVar92._4_4_ = auVar59._4_4_ * fVar62;
      fVar63 = auVar93._8_4_;
      auVar92._8_4_ = auVar59._8_4_ * fVar63;
      fVar110 = auVar93._12_4_;
      auVar92._12_4_ = auVar59._12_4_ * fVar110;
      auVar93 = vsubps_avx(auVar114,auVar92);
      tray.rdir.field_0._16_4_ = fVar61 + fVar61 * auVar93._0_4_;
      tray.rdir.field_0._20_4_ = fVar62 + fVar62 * auVar93._4_4_;
      tray.rdir.field_0._24_4_ = fVar63 + fVar63 * auVar93._8_4_;
      tray.rdir.field_0._28_4_ = fVar110 + fVar110 * auVar93._12_4_;
      auVar93 = vrcpps_avx(auVar50);
      fVar61 = auVar93._0_4_;
      auVar59._0_4_ = auVar50._0_4_ * fVar61;
      fVar62 = auVar93._4_4_;
      auVar59._4_4_ = auVar50._4_4_ * fVar62;
      fVar63 = auVar93._8_4_;
      auVar59._8_4_ = auVar50._8_4_ * fVar63;
      fVar110 = auVar93._12_4_;
      auVar59._12_4_ = auVar50._12_4_ * fVar110;
      auVar50 = vsubps_avx(auVar114,auVar59);
      tray.rdir.field_0._32_4_ = fVar61 + fVar61 * auVar50._0_4_;
      tray.rdir.field_0._36_4_ = fVar62 + fVar62 * auVar50._4_4_;
      tray.rdir.field_0._40_4_ = fVar63 + fVar63 * auVar50._8_4_;
      tray.rdir.field_0._44_4_ = fVar110 + fVar110 * auVar50._12_4_;
      auVar50 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar118,1);
      auVar106._8_4_ = 0x10;
      auVar106._0_8_ = 0x1000000010;
      auVar106._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar50,auVar106);
      auVar50 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar118,5);
      auVar93._8_4_ = 0x20;
      auVar93._0_8_ = 0x2000000020;
      auVar93._12_4_ = 0x20;
      auVar107._8_4_ = 0x30;
      auVar107._0_8_ = 0x3000000030;
      auVar107._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar107,auVar93,auVar50)
      ;
      auVar50 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar118,5);
      auVar97._8_4_ = 0x40;
      auVar97._0_8_ = 0x4000000040;
      auVar97._12_4_ = 0x40;
      auVar108._8_4_ = 0x50;
      auVar108._0_8_ = 0x5000000050;
      auVar108._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar108,auVar97,auVar50)
      ;
      auVar50 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar118);
      auVar93 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar118);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar137 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar50,auVar76);
      auVar50._8_4_ = 0xff800000;
      auVar50._0_8_ = 0xff800000ff800000;
      auVar50._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar50,auVar93,auVar76);
      terminated.field_0.i[1] = auVar76._4_4_ ^ auVar87._4_4_;
      terminated.field_0.i[0] = auVar76._0_4_ ^ auVar87._0_4_;
      terminated.field_0.i[2] = auVar76._8_4_ ^ auVar87._8_4_;
      terminated.field_0.i[3] = auVar76._12_4_ ^ auVar87._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar39 = 3;
      }
      else {
        uVar39 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_1990 = ray + 0x80;
      pNVar41 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar35 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar87 = vpcmpeqd_avx(in_ZMM11._0_16_,in_ZMM11._0_16_);
      auVar141 = ZEXT1664(auVar87);
LAB_003215a8:
      paVar35 = &((vfloat<4> *)paVar35)[-1].field_0;
      root.ptr = pNVar41[-1].ptr;
      pNVar41 = pNVar41 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_00322438;
      aVar148 = *paVar35;
      auVar87 = vcmpps_avx((undefined1  [16])aVar148,(undefined1  [16])tray.tfar.field_0,1);
      uVar31 = vmovmskps_avx(auVar87);
      if (uVar31 == 0) {
LAB_00322449:
        iVar32 = 2;
      }
      else {
        uVar37 = (ulong)(uVar31 & 0xff);
        uVar31 = POPCOUNT(uVar31 & 0xff);
        iVar32 = 0;
        if (uVar31 <= uVar39) {
          do {
            k = 0;
            if (uVar37 != 0) {
              for (; (uVar37 >> k & 1) == 0; k = k + 1) {
              }
            }
            auVar141 = ZEXT1664(auVar141._0_16_);
            bVar42 = occluded1(This,bvh,root,k,&pre,ray,&tray,context);
            if (bVar42) {
              terminated.field_0.i[k] = -1;
            }
            uVar37 = uVar37 & uVar37 - 1;
          } while (uVar37 != 0);
          auVar87 = vpcmpeqd_avx(auVar141._0_16_,auVar141._0_16_);
          auVar141 = ZEXT1664(auVar87);
          auVar87 = auVar87 & ~(undefined1  [16])terminated.field_0;
          iVar32 = 3;
          auVar137 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
          if ((((auVar87 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar87 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar87 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar87[0xf] < '\0') {
            auVar87._8_4_ = 0xff800000;
            auVar87._0_8_ = 0xff800000ff800000;
            auVar87._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar87,
                               (undefined1  [16])terminated.field_0);
            iVar32 = 2;
          }
        }
        if (uVar39 < uVar31) {
          do {
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_00322438;
              auVar87 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar148,6);
              if ((((auVar87 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar87 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar87 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar87[0xf]) goto LAB_00322449;
              uVar37 = (ulong)((uint)root.ptr & 0xf);
              aVar60 = terminated.field_0;
              if (uVar37 == 8) goto LAB_003223fa;
              lVar40 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
              uVar38 = 0;
              auVar87 = auVar141._0_16_ ^ (undefined1  [16])terminated.field_0;
              goto LAB_003217e2;
            }
            auVar150 = ZEXT1664(auVar137._0_16_);
            uVar37 = 0;
            uVar38 = 8;
            do {
              uVar36 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + uVar37 * 8);
              if (uVar36 != 8) {
                uVar34 = *(undefined4 *)(root.ptr + 0x20 + uVar37 * 4);
                auVar44._4_4_ = uVar34;
                auVar44._0_4_ = uVar34;
                auVar44._8_4_ = uVar34;
                auVar44._12_4_ = uVar34;
                auVar21._8_8_ = tray.org.field_0._8_8_;
                auVar21._0_8_ = tray.org.field_0._0_8_;
                auVar22._8_8_ = tray.org.field_0._24_8_;
                auVar22._0_8_ = tray.org.field_0._16_8_;
                auVar23._8_8_ = tray.org.field_0._40_8_;
                auVar23._0_8_ = tray.org.field_0._32_8_;
                auVar87 = vsubps_avx(auVar44,auVar21);
                auVar98._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar87._0_4_;
                auVar98._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar87._4_4_;
                auVar98._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar87._8_4_;
                auVar98._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar87._12_4_;
                uVar34 = *(undefined4 *)(root.ptr + 0x40 + uVar37 * 4);
                auVar45._4_4_ = uVar34;
                auVar45._0_4_ = uVar34;
                auVar45._8_4_ = uVar34;
                auVar45._12_4_ = uVar34;
                auVar87 = vsubps_avx(auVar45,auVar22);
                auVar115._0_4_ = tray.rdir.field_0._16_4_ * auVar87._0_4_;
                auVar115._4_4_ = tray.rdir.field_0._20_4_ * auVar87._4_4_;
                auVar115._8_4_ = tray.rdir.field_0._24_4_ * auVar87._8_4_;
                auVar115._12_4_ = tray.rdir.field_0._28_4_ * auVar87._12_4_;
                uVar34 = *(undefined4 *)(root.ptr + 0x60 + uVar37 * 4);
                auVar46._4_4_ = uVar34;
                auVar46._0_4_ = uVar34;
                auVar46._8_4_ = uVar34;
                auVar46._12_4_ = uVar34;
                auVar87 = vsubps_avx(auVar46,auVar23);
                auVar133._0_4_ = tray.rdir.field_0._32_4_ * auVar87._0_4_;
                auVar133._4_4_ = tray.rdir.field_0._36_4_ * auVar87._4_4_;
                auVar133._8_4_ = tray.rdir.field_0._40_4_ * auVar87._8_4_;
                auVar133._12_4_ = tray.rdir.field_0._44_4_ * auVar87._12_4_;
                uVar34 = *(undefined4 *)(root.ptr + 0x30 + uVar37 * 4);
                auVar47._4_4_ = uVar34;
                auVar47._0_4_ = uVar34;
                auVar47._8_4_ = uVar34;
                auVar47._12_4_ = uVar34;
                auVar87 = vsubps_avx(auVar47,auVar21);
                auVar65._0_4_ = (float)tray.rdir.field_0._0_4_ * auVar87._0_4_;
                auVar65._4_4_ = (float)tray.rdir.field_0._4_4_ * auVar87._4_4_;
                auVar65._8_4_ = (float)tray.rdir.field_0._8_4_ * auVar87._8_4_;
                auVar65._12_4_ = (float)tray.rdir.field_0._12_4_ * auVar87._12_4_;
                uVar34 = *(undefined4 *)(root.ptr + 0x50 + uVar37 * 4);
                auVar48._4_4_ = uVar34;
                auVar48._0_4_ = uVar34;
                auVar48._8_4_ = uVar34;
                auVar48._12_4_ = uVar34;
                auVar87 = vsubps_avx(auVar48,auVar22);
                auVar78._0_4_ = tray.rdir.field_0._16_4_ * auVar87._0_4_;
                auVar78._4_4_ = tray.rdir.field_0._20_4_ * auVar87._4_4_;
                auVar78._8_4_ = tray.rdir.field_0._24_4_ * auVar87._8_4_;
                auVar78._12_4_ = tray.rdir.field_0._28_4_ * auVar87._12_4_;
                uVar34 = *(undefined4 *)(root.ptr + 0x70 + uVar37 * 4);
                auVar49._4_4_ = uVar34;
                auVar49._0_4_ = uVar34;
                auVar49._8_4_ = uVar34;
                auVar49._12_4_ = uVar34;
                auVar87 = vsubps_avx(auVar49,auVar23);
                auVar89._0_4_ = tray.rdir.field_0._32_4_ * auVar87._0_4_;
                auVar89._4_4_ = tray.rdir.field_0._36_4_ * auVar87._4_4_;
                auVar89._8_4_ = tray.rdir.field_0._40_4_ * auVar87._8_4_;
                auVar89._12_4_ = tray.rdir.field_0._44_4_ * auVar87._12_4_;
                auVar87 = vpminsd_avx(auVar98,auVar65);
                auVar50 = vpminsd_avx(auVar115,auVar78);
                auVar87 = vpmaxsd_avx(auVar87,auVar50);
                auVar50 = vpminsd_avx(auVar133,auVar89);
                auVar50 = vpmaxsd_avx(auVar87,auVar50);
                auVar87 = vpmaxsd_avx(auVar98,auVar65);
                auVar93 = vpmaxsd_avx(auVar115,auVar78);
                auVar93 = vpminsd_avx(auVar87,auVar93);
                auVar87 = vpmaxsd_avx(auVar133,auVar89);
                auVar93 = vpminsd_avx(auVar93,auVar87);
                auVar87 = vpmaxsd_avx(auVar50,(undefined1  [16])tray.tnear.field_0);
                auVar93 = vpminsd_avx(auVar93,(undefined1  [16])tray.tfar.field_0);
                auVar87 = vcmpps_avx(auVar87,auVar93,2);
                if ((((auVar87 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar87 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar87 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar87[0xf] < '\0') {
                  auVar87 = vblendvps_avx(auVar137._0_16_,auVar50,auVar87);
                  if (uVar38 != 8) {
                    pNVar41->ptr = uVar38;
                    pNVar41 = pNVar41 + 1;
                    *paVar35 = auVar150._0_16_;
                    paVar35 = paVar35 + 1;
                  }
                  auVar150 = ZEXT1664(auVar87);
                  uVar38 = uVar36;
                }
              }
              aVar148 = auVar150._0_16_;
            } while ((uVar36 != 8) && (bVar42 = uVar37 < 3, uVar37 = uVar37 + 1, bVar42));
            iVar32 = 0;
            if (uVar38 == 8) {
LAB_00321788:
              bVar42 = false;
              iVar32 = 4;
            }
            else {
              auVar87 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])aVar148,6);
              uVar34 = vmovmskps_avx(auVar87);
              bVar42 = true;
              if ((uint)POPCOUNT(uVar34) <= uVar39) {
                pNVar41->ptr = uVar38;
                pNVar41 = pNVar41 + 1;
                *paVar35 = aVar148;
                paVar35 = paVar35 + 1;
                goto LAB_00321788;
              }
            }
            root.ptr = uVar38;
          } while (bVar42);
        }
      }
      goto LAB_0032243b;
    }
  }
  return;
  while( true ) {
    uVar38 = uVar38 + 1;
    lVar40 = lVar40 + 0xe0;
    auVar87 = auVar93;
    if (uVar37 - 8 <= uVar38) break;
LAB_003217e2:
    lVar33 = uVar38 * 0xe0 + (root.ptr & 0xfffffffffffffff0);
    auVar150 = ZEXT1664(auVar87);
    uVar36 = 0;
    while( true ) {
      auVar50 = auVar150._0_16_;
      uVar31 = *(uint *)(lVar40 + uVar36 * 4);
      if ((ulong)uVar31 == 0xffffffff) break;
      fVar61 = *(float *)(lVar40 + -0xc0 + uVar36 * 4);
      auVar118._4_4_ = fVar61;
      auVar118._0_4_ = fVar61;
      auVar118._8_4_ = fVar61;
      auVar118._12_4_ = fVar61;
      fVar62 = *(float *)(lVar40 + -0xb0 + uVar36 * 4);
      auVar66._4_4_ = fVar62;
      auVar66._0_4_ = fVar62;
      auVar66._8_4_ = fVar62;
      auVar66._12_4_ = fVar62;
      fVar63 = *(float *)(lVar40 + -0xa0 + uVar36 * 4);
      auVar79._4_4_ = fVar63;
      auVar79._0_4_ = fVar63;
      auVar79._8_4_ = fVar63;
      auVar79._12_4_ = fVar63;
      local_1988._4_4_ = *(float *)(lVar40 + -0x90 + uVar36 * 4);
      local_1908._4_4_ = *(float *)(lVar40 + -0x80 + uVar36 * 4);
      fVar110 = *(float *)(lVar40 + -0x70 + uVar36 * 4);
      local_1918._4_4_ = *(undefined4 *)(lVar40 + -0x60 + uVar36 * 4);
      local_1918._0_4_ = local_1918._4_4_;
      local_1918._8_4_ = local_1918._4_4_;
      local_1918._12_4_ = local_1918._4_4_;
      local_1928._4_4_ = *(undefined4 *)(lVar40 + -0x50 + uVar36 * 4);
      local_1928._0_4_ = local_1928._4_4_;
      local_1928._8_4_ = local_1928._4_4_;
      local_1928._12_4_ = local_1928._4_4_;
      uVar34 = *(undefined4 *)(lVar40 + -0x40 + uVar36 * 4);
      fVar43 = *(float *)(lVar40 + -0x30 + uVar36 * 4);
      fVar2 = *(float *)(lVar40 + -0x20 + uVar36 * 4);
      fVar3 = *(float *)(lVar40 + -0x10 + uVar36 * 4);
      local_18c8 = *(undefined8 *)(lVar33 + 0xd0);
      uStack_18c0 = *(undefined8 *)(lVar33 + 0xd8);
      local_1908._0_4_ = local_1908._4_4_;
      fStack_1900 = (float)local_1908._4_4_;
      fStack_18fc = (float)local_1908._4_4_;
      fVar138 = fVar62 - (float)local_1908._4_4_;
      fVar64 = fVar63 - fVar110;
      fVar62 = fVar2 - fVar62;
      fVar63 = fVar3 - fVar63;
      local_1988._0_4_ = local_1988._4_4_;
      fStack_1980 = (float)local_1988._4_4_;
      fStack_197c = (float)local_1988._4_4_;
      fVar17 = fVar61 - (float)local_1988._4_4_;
      fVar61 = fVar43 - fVar61;
      auVar93 = vsubps_avx(auVar118,*(undefined1 (*) [16])ray);
      auVar118 = vsubps_avx(auVar66,*(undefined1 (*) [16])(ray + 0x10));
      auVar59 = vsubps_avx(auVar79,*(undefined1 (*) [16])(ray + 0x20));
      fVar7 = *(float *)(ray + 0x50);
      fVar8 = *(float *)(ray + 0x54);
      fVar9 = *(float *)(ray + 0x58);
      fVar10 = *(float *)(ray + 0x5c);
      fVar11 = *(float *)(ray + 0x60);
      fVar12 = *(float *)(ray + 100);
      fVar13 = *(float *)(ray + 0x68);
      fVar14 = *(float *)(ray + 0x6c);
      fVar125 = auVar59._0_4_;
      auVar153._0_4_ = fVar125 * fVar7;
      fVar128 = auVar59._4_4_;
      auVar153._4_4_ = fVar128 * fVar8;
      fVar112 = auVar59._8_4_;
      auVar153._8_4_ = fVar112 * fVar9;
      fVar120 = auVar59._12_4_;
      auVar153._12_4_ = fVar120 * fVar10;
      fVar111 = auVar118._0_4_;
      auVar158._0_4_ = fVar111 * fVar11;
      fVar119 = auVar118._4_4_;
      auVar158._4_4_ = fVar119 * fVar12;
      fVar121 = auVar118._8_4_;
      auVar158._8_4_ = fVar121 * fVar13;
      fVar123 = auVar118._12_4_;
      auVar158._12_4_ = fVar123 * fVar14;
      auVar106 = vsubps_avx(auVar158,auVar153);
      fVar15 = *(float *)(ray + 0x40);
      fVar16 = *(float *)(ray + 0x44);
      fVar18 = *(float *)(ray + 0x48);
      fVar19 = *(float *)(ray + 0x4c);
      fVar96 = auVar93._0_4_;
      auVar154._0_4_ = fVar96 * fVar11;
      fVar103 = auVar93._4_4_;
      auVar154._4_4_ = fVar103 * fVar12;
      fVar104 = auVar93._8_4_;
      auVar154._8_4_ = fVar104 * fVar13;
      fVar105 = auVar93._12_4_;
      auVar154._12_4_ = fVar105 * fVar14;
      auVar159._0_4_ = fVar125 * fVar15;
      auVar159._4_4_ = fVar128 * fVar16;
      auVar159._8_4_ = fVar112 * fVar18;
      auVar159._12_4_ = fVar120 * fVar19;
      auVar107 = vsubps_avx(auVar159,auVar154);
      auVar160._0_4_ = fVar111 * fVar15;
      auVar160._4_4_ = fVar119 * fVar16;
      auVar160._8_4_ = fVar121 * fVar18;
      auVar160._12_4_ = fVar123 * fVar19;
      auVar134._0_4_ = fVar96 * fVar7;
      auVar134._4_4_ = fVar103 * fVar8;
      auVar134._8_4_ = fVar104 * fVar9;
      auVar134._12_4_ = fVar105 * fVar10;
      auVar108 = vsubps_avx(auVar134,auVar160);
      auVar93 = ZEXT416((uint)(fVar17 * fVar63 - fVar61 * fVar64));
      auVar59 = vshufps_avx(auVar93,auVar93,0);
      auVar93 = ZEXT416((uint)(fVar61 * fVar138 - fVar17 * fVar62));
      auVar92 = vshufps_avx(auVar93,auVar93,0);
      auVar113 = vpermilps_avx(ZEXT416((uint)(fVar64 * fVar62 - fVar63 * fVar138)),0);
      auVar135._0_4_ = auVar113._0_4_ * fVar15 + auVar59._0_4_ * fVar7 + auVar92._0_4_ * fVar11;
      auVar135._4_4_ = auVar113._4_4_ * fVar16 + auVar59._4_4_ * fVar8 + auVar92._4_4_ * fVar12;
      auVar135._8_4_ = auVar113._8_4_ * fVar18 + auVar59._8_4_ * fVar9 + auVar92._8_4_ * fVar13;
      auVar135._12_4_ = auVar113._12_4_ * fVar19 + auVar59._12_4_ * fVar10 + auVar92._12_4_ * fVar14
      ;
      auVar118 = vshufps_avx(ZEXT416((uint)fVar62),ZEXT416((uint)fVar62),0);
      auVar88 = vshufps_avx(ZEXT416((uint)fVar63),ZEXT416((uint)fVar63),0);
      auVar97 = vshufps_avx(ZEXT416((uint)fVar61),ZEXT416((uint)fVar61),0);
      auVar67._8_4_ = 0x80000000;
      auVar67._0_8_ = 0x8000000080000000;
      auVar67._12_4_ = 0x80000000;
      auVar93 = vandps_avx(auVar135,auVar67);
      uVar139 = auVar93._0_4_;
      auVar94._0_4_ =
           (float)(uVar139 ^
                  (uint)(auVar97._0_4_ * auVar106._0_4_ +
                        auVar107._0_4_ * auVar118._0_4_ + auVar108._0_4_ * auVar88._0_4_));
      uVar142 = auVar93._4_4_;
      auVar94._4_4_ =
           (float)(uVar142 ^
                  (uint)(auVar97._4_4_ * auVar106._4_4_ +
                        auVar107._4_4_ * auVar118._4_4_ + auVar108._4_4_ * auVar88._4_4_));
      uVar144 = auVar93._8_4_;
      auVar94._8_4_ =
           (float)(uVar144 ^
                  (uint)(auVar97._8_4_ * auVar106._8_4_ +
                        auVar107._8_4_ * auVar118._8_4_ + auVar108._8_4_ * auVar88._8_4_));
      uVar146 = auVar93._12_4_;
      auVar94._12_4_ =
           (float)(uVar146 ^
                  (uint)(auVar97._12_4_ * auVar106._12_4_ +
                        auVar107._12_4_ * auVar118._12_4_ + auVar108._12_4_ * auVar88._12_4_));
      auVar150 = ZEXT1664(auVar50);
      auVar118 = vcmpps_avx(auVar94,_DAT_01feba10,5);
      auVar88 = auVar50 & auVar118;
      if ((((auVar88 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar88 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar88 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar88[0xf] < '\0'
         ) {
        auVar88 = vshufps_avx(ZEXT416((uint)fVar17),ZEXT416((uint)fVar17),0);
        auVar97 = vpermilps_avx(ZEXT416((uint)fVar138),0);
        auVar114 = vpermilps_avx(ZEXT416((uint)fVar64),0);
        auVar118 = vandps_avx(auVar118,auVar50);
        auVar100._0_4_ =
             (float)(uVar139 ^
                    (uint)(auVar88._0_4_ * auVar106._0_4_ +
                          auVar107._0_4_ * auVar97._0_4_ + auVar108._0_4_ * auVar114._0_4_));
        auVar100._4_4_ =
             (float)(uVar142 ^
                    (uint)(auVar88._4_4_ * auVar106._4_4_ +
                          auVar107._4_4_ * auVar97._4_4_ + auVar108._4_4_ * auVar114._4_4_));
        auVar100._8_4_ =
             (float)(uVar144 ^
                    (uint)(auVar88._8_4_ * auVar106._8_4_ +
                          auVar107._8_4_ * auVar97._8_4_ + auVar108._8_4_ * auVar114._8_4_));
        auVar100._12_4_ =
             (float)(uVar146 ^
                    (uint)(auVar88._12_4_ * auVar106._12_4_ +
                          auVar107._12_4_ * auVar97._12_4_ + auVar108._12_4_ * auVar114._12_4_));
        auVar88 = vcmpps_avx(auVar100,_DAT_01feba10,5);
        auVar97 = auVar118 & auVar88;
        if ((((auVar97 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar97 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar97 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar97[0xf] < '\0') {
          auVar52._8_4_ = 0x7fffffff;
          auVar52._0_8_ = 0x7fffffff7fffffff;
          auVar52._12_4_ = 0x7fffffff;
          auVar97 = vandps_avx(auVar135,auVar52);
          auVar118 = vandps_avx(auVar88,auVar118);
          auVar88 = vsubps_avx(auVar97,auVar94);
          auVar88 = vcmpps_avx(auVar88,auVar100,5);
          auVar106 = auVar118 & auVar88;
          if ((((auVar106 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar106 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar106 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar106[0xf] < '\0') {
            auVar118 = vandps_avx(auVar88,auVar118);
            auVar54._0_4_ =
                 (float)(uVar139 ^
                        (uint)(auVar113._0_4_ * fVar96 +
                              auVar59._0_4_ * fVar111 + fVar125 * auVar92._0_4_));
            auVar54._4_4_ =
                 (float)(uVar142 ^
                        (uint)(auVar113._4_4_ * fVar103 +
                              auVar59._4_4_ * fVar119 + fVar128 * auVar92._4_4_));
            auVar54._8_4_ =
                 (float)(uVar144 ^
                        (uint)(auVar113._8_4_ * fVar104 +
                              auVar59._8_4_ * fVar121 + fVar112 * auVar92._8_4_));
            auVar54._12_4_ =
                 (float)(uVar146 ^
                        (uint)(auVar113._12_4_ * fVar105 +
                              auVar59._12_4_ * fVar123 + fVar120 * auVar92._12_4_));
            fVar61 = auVar97._0_4_;
            auVar71._0_4_ = fVar61 * *(float *)(ray + 0x30);
            fVar62 = auVar97._4_4_;
            auVar71._4_4_ = fVar62 * *(float *)(ray + 0x34);
            fVar63 = auVar97._8_4_;
            auVar71._8_4_ = fVar63 * *(float *)(ray + 0x38);
            fVar138 = auVar97._12_4_;
            auVar71._12_4_ = fVar138 * *(float *)(ray + 0x3c);
            auVar88 = vcmpps_avx(auVar71,auVar54,1);
            pRVar1 = ray + 0x80;
            auVar107 = *(undefined1 (*) [16])pRVar1;
            auVar116._0_4_ = fVar61 * *(float *)pRVar1;
            auVar116._4_4_ = fVar62 * *(float *)(ray + 0x84);
            auVar116._8_4_ = fVar63 * *(float *)(ray + 0x88);
            auVar116._12_4_ = fVar138 * *(float *)(ray + 0x8c);
            auVar106 = vcmpps_avx(auVar54,auVar116,2);
            auVar88 = vandps_avx(auVar106,auVar88);
            auVar106 = auVar118 & auVar88;
            if ((((auVar106 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar106 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar106 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar106[0xf] < '\0') {
              auVar118 = vandps_avx(auVar88,auVar118);
              auVar88 = vcmpps_avx(auVar135,_DAT_01feba10,4);
              auVar106 = auVar118 & auVar88;
              if ((((auVar106 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar106 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar106 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar106[0xf] < '\0') {
                auVar118 = vandps_avx(auVar88,auVar118);
                pGVar4 = (context->scene->geometries).items[uVar31].ptr;
                uVar139 = pGVar4->mask;
                auVar72._4_4_ = uVar139;
                auVar72._0_4_ = uVar139;
                auVar72._8_4_ = uVar139;
                auVar72._12_4_ = uVar139;
                auVar88 = vandps_avx(auVar72,*(undefined1 (*) [16])(ray + 0x90));
                auVar88 = vpcmpeqd_avx(auVar88,_DAT_01feba10);
                auVar106 = auVar118 & ~auVar88;
                if ((((auVar106 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar106 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar106 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar106[0xf] < '\0') {
                  auVar118 = vandnps_avx(auVar88,auVar118);
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar88 = vrcpps_avx(auVar97);
                    fVar64 = auVar88._0_4_;
                    auVar117._0_4_ = fVar61 * fVar64;
                    fVar61 = auVar88._4_4_;
                    auVar117._4_4_ = fVar62 * fVar61;
                    fVar62 = auVar88._8_4_;
                    auVar117._8_4_ = fVar63 * fVar62;
                    fVar63 = auVar88._12_4_;
                    auVar117._12_4_ = fVar138 * fVar63;
                    auVar127._8_4_ = 0x3f800000;
                    auVar127._0_8_ = &DAT_3f8000003f800000;
                    auVar127._12_4_ = 0x3f800000;
                    auVar88 = vsubps_avx(auVar127,auVar117);
                    fVar64 = fVar64 + fVar64 * auVar88._0_4_;
                    fVar61 = fVar61 + fVar61 * auVar88._4_4_;
                    fVar62 = fVar62 + fVar62 * auVar88._8_4_;
                    fVar63 = fVar63 + fVar63 * auVar88._12_4_;
                    auVar91._0_4_ = fVar64 * auVar94._0_4_;
                    auVar91._4_4_ = fVar61 * auVar94._4_4_;
                    auVar91._8_4_ = fVar62 * auVar94._8_4_;
                    auVar91._12_4_ = fVar63 * auVar94._12_4_;
                    auVar88 = vminps_avx(auVar91,auVar127);
                    auVar102._0_4_ = fVar64 * auVar100._0_4_;
                    auVar102._4_4_ = fVar61 * auVar100._4_4_;
                    auVar102._8_4_ = fVar62 * auVar100._8_4_;
                    auVar102._12_4_ = fVar63 * auVar100._12_4_;
                    auVar97 = vminps_avx(auVar102,auVar127);
                    auVar106 = vsubps_avx(auVar127,auVar88);
                    auVar108 = vsubps_avx(auVar127,auVar97);
                    auVar24._8_8_ = uVar30;
                    auVar24._0_8_ = uVar29;
                    local_1888 = vblendvps_avx(auVar88,auVar106,auVar24);
                    local_1878 = vblendvps_avx(auVar97,auVar108,auVar24);
                    local_1858 = vpshufd_avx(ZEXT416(uVar31),0);
                    local_1868 = vpshufd_avx(ZEXT416(*(uint *)((long)&local_18c8 + uVar36 * 4)),0);
                    local_18b8[0] = (RTCHitN)auVar113[0];
                    local_18b8[1] = (RTCHitN)auVar113[1];
                    local_18b8[2] = (RTCHitN)auVar113[2];
                    local_18b8[3] = (RTCHitN)auVar113[3];
                    local_18b8[4] = (RTCHitN)auVar113[4];
                    local_18b8[5] = (RTCHitN)auVar113[5];
                    local_18b8[6] = (RTCHitN)auVar113[6];
                    local_18b8[7] = (RTCHitN)auVar113[7];
                    local_18b8[8] = (RTCHitN)auVar113[8];
                    local_18b8[9] = (RTCHitN)auVar113[9];
                    local_18b8[10] = (RTCHitN)auVar113[10];
                    local_18b8[0xb] = (RTCHitN)auVar113[0xb];
                    local_18b8[0xc] = (RTCHitN)auVar113[0xc];
                    local_18b8[0xd] = (RTCHitN)auVar113[0xd];
                    local_18b8[0xe] = (RTCHitN)auVar113[0xe];
                    local_18b8[0xf] = (RTCHitN)auVar113[0xf];
                    local_18a8 = auVar59;
                    local_1898 = auVar92;
                    auVar57._0_4_ = fVar64 * auVar54._0_4_;
                    auVar57._4_4_ = fVar61 * auVar54._4_4_;
                    auVar57._8_4_ = fVar62 * auVar54._8_4_;
                    auVar57._12_4_ = fVar63 * auVar54._12_4_;
                    auVar77 = ZEXT1632(CONCAT412(fVar63,CONCAT48(fVar62,CONCAT44(fVar61,fVar64))));
                    vcmpps_avx(auVar77,auVar77,0xf);
                    uStack_1844 = context->user->instID[0];
                    local_1848 = uStack_1844;
                    uStack_1840 = uStack_1844;
                    uStack_183c = uStack_1844;
                    uStack_1838 = context->user->instPrimID[0];
                    uStack_1834 = uStack_1838;
                    uStack_1830 = uStack_1838;
                    uStack_182c = uStack_1838;
                    auVar59 = vblendvps_avx(*(undefined1 (*) [16])pRVar1,auVar57,auVar118);
                    *(undefined1 (*) [16])(ray + 0x80) = auVar59;
                    args.valid = (int *)local_19a8;
                    args.geometryUserPtr = pGVar4->userPtr;
                    args.context = context->user;
                    args.hit = local_18b8;
                    args.N = 4;
                    local_19a8 = auVar118;
                    args.ray = (RTCRayN *)ray;
                    if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      (*pGVar4->occlusionFilterN)(&args);
                    }
                    if (local_19a8 == (undefined1  [16])0x0) {
                      auVar118 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                      auVar118 = auVar118 ^ _DAT_01febe20;
                    }
                    else {
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var5)(&args);
                      }
                      auVar59 = vpcmpeqd_avx((undefined1  [16])0x0,local_19a8);
                      auVar118 = auVar59 ^ _DAT_01febe20;
                      auVar83._8_4_ = 0xff800000;
                      auVar83._0_8_ = 0xff800000ff800000;
                      auVar83._12_4_ = 0xff800000;
                      auVar59 = vblendvps_avx(auVar83,*(undefined1 (*) [16])(args.ray + 0x80),
                                              auVar59);
                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar59;
                    }
                    auVar59 = vpslld_avx(auVar118,0x1f);
                    auVar118 = vpsrad_avx(auVar59,0x1f);
                    auVar59 = vblendvps_avx(auVar107,*(undefined1 (*) [16])local_1990,auVar59);
                    *(undefined1 (*) [16])local_1990 = auVar59;
                  }
                  auVar50 = vpandn_avx(auVar118,auVar50);
                  auVar150 = ZEXT1664(auVar50);
                  goto LAB_003219f7;
                }
              }
            }
          }
        }
        auVar150 = ZEXT1664(auVar50);
      }
LAB_003219f7:
      auVar50 = auVar150._0_16_;
      if ((((auVar50 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar50 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar50 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar150[0xf])
      {
        bVar42 = false;
        auVar93 = vpcmpeqd_avx(auVar93,auVar93);
      }
      else {
        auVar27._4_4_ = fVar43;
        auVar27._0_4_ = fVar43;
        auVar27._8_4_ = fVar43;
        auVar27._12_4_ = fVar43;
        auVar59 = vsubps_avx(local_1918,auVar27);
        auVar26._4_4_ = fVar2;
        auVar26._0_4_ = fVar2;
        auVar26._8_4_ = fVar2;
        auVar26._12_4_ = fVar2;
        auVar93 = vsubps_avx(local_1928,auVar26);
        auVar20._4_4_ = uVar34;
        auVar20._0_4_ = uVar34;
        auVar20._8_4_ = uVar34;
        auVar20._12_4_ = uVar34;
        auVar25._4_4_ = fVar3;
        auVar25._0_4_ = fVar3;
        auVar25._8_4_ = fVar3;
        auVar25._12_4_ = fVar3;
        auVar118 = vsubps_avx(auVar20,auVar25);
        auVar92 = vsubps_avx(_local_1988,local_1918);
        auVar88 = vsubps_avx(_local_1908,local_1928);
        auVar28._4_4_ = fVar110;
        auVar28._0_4_ = fVar110;
        auVar28._8_4_ = fVar110;
        auVar28._12_4_ = fVar110;
        auVar97 = vsubps_avx(auVar28,auVar20);
        fVar61 = auVar93._0_4_;
        fVar157 = auVar97._0_4_;
        auVar51._0_4_ = fVar157 * fVar61;
        fVar2 = auVar93._4_4_;
        fVar161 = auVar97._4_4_;
        auVar51._4_4_ = fVar161 * fVar2;
        fVar7 = auVar93._8_4_;
        fVar162 = auVar97._8_4_;
        auVar51._8_4_ = fVar162 * fVar7;
        fVar12 = auVar93._12_4_;
        fVar163 = auVar97._12_4_;
        auVar51._12_4_ = fVar163 * fVar12;
        fVar62 = auVar118._0_4_;
        fVar140 = auVar88._0_4_;
        auVar68._0_4_ = fVar140 * fVar62;
        fVar3 = auVar118._4_4_;
        fVar143 = auVar88._4_4_;
        auVar68._4_4_ = fVar143 * fVar3;
        fVar8 = auVar118._8_4_;
        fVar145 = auVar88._8_4_;
        auVar68._8_4_ = fVar145 * fVar8;
        fVar13 = auVar118._12_4_;
        fVar147 = auVar88._12_4_;
        auVar68._12_4_ = fVar147 * fVar13;
        auVar88 = vsubps_avx(auVar68,auVar51);
        fVar63 = auVar92._0_4_;
        auVar69._0_4_ = fVar62 * fVar63;
        fVar138 = auVar92._4_4_;
        auVar69._4_4_ = fVar3 * fVar138;
        fVar9 = auVar92._8_4_;
        auVar69._8_4_ = fVar8 * fVar9;
        fVar14 = auVar92._12_4_;
        auVar69._12_4_ = fVar13 * fVar14;
        fVar110 = auVar59._0_4_;
        auVar80._0_4_ = fVar157 * fVar110;
        fVar64 = auVar59._4_4_;
        auVar80._4_4_ = fVar161 * fVar64;
        fVar10 = auVar59._8_4_;
        auVar80._8_4_ = fVar162 * fVar10;
        fVar15 = auVar59._12_4_;
        auVar80._12_4_ = fVar163 * fVar15;
        auVar92 = vsubps_avx(auVar80,auVar69);
        auVar81._0_4_ = fVar140 * fVar110;
        auVar81._4_4_ = fVar143 * fVar64;
        auVar81._8_4_ = fVar145 * fVar10;
        auVar81._12_4_ = fVar147 * fVar15;
        auVar99._0_4_ = fVar63 * fVar61;
        auVar99._4_4_ = fVar138 * fVar2;
        auVar99._8_4_ = fVar9 * fVar7;
        auVar99._12_4_ = fVar14 * fVar12;
        auVar97 = vsubps_avx(auVar99,auVar81);
        auVar93 = vsubps_avx(local_1918,*(undefined1 (*) [16])ray);
        auVar118 = vsubps_avx(local_1928,*(undefined1 (*) [16])(ray + 0x10));
        auVar106 = vsubps_avx(auVar20,*(undefined1 (*) [16])(ray + 0x20));
        fVar18 = *(float *)(ray + 0x50);
        fVar19 = *(float *)(ray + 0x54);
        fVar96 = *(float *)(ray + 0x58);
        fVar103 = *(float *)(ray + 0x5c);
        fVar104 = *(float *)(ray + 0x60);
        fVar105 = *(float *)(ray + 100);
        fVar111 = *(float *)(ray + 0x68);
        fVar119 = *(float *)(ray + 0x6c);
        fVar43 = auVar106._0_4_;
        auVar149._0_4_ = fVar18 * fVar43;
        fVar17 = auVar106._4_4_;
        auVar149._4_4_ = fVar19 * fVar17;
        fVar11 = auVar106._8_4_;
        auVar149._8_4_ = fVar96 * fVar11;
        fVar16 = auVar106._12_4_;
        auVar149._12_4_ = fVar103 * fVar16;
        fVar126 = auVar118._0_4_;
        auVar151._0_4_ = fVar126 * fVar104;
        fVar129 = auVar118._4_4_;
        auVar151._4_4_ = fVar129 * fVar105;
        fVar130 = auVar118._8_4_;
        auVar151._8_4_ = fVar130 * fVar111;
        fVar131 = auVar118._12_4_;
        auVar151._12_4_ = fVar131 * fVar119;
        auVar106 = vsubps_avx(auVar151,auVar149);
        fVar121 = *(float *)(ray + 0x40);
        fVar123 = *(float *)(ray + 0x44);
        fVar125 = *(float *)(ray + 0x48);
        fVar128 = *(float *)(ray + 0x4c);
        fVar112 = auVar93._0_4_;
        auVar152._0_4_ = fVar112 * fVar104;
        fVar120 = auVar93._4_4_;
        auVar152._4_4_ = fVar120 * fVar105;
        fVar122 = auVar93._8_4_;
        auVar152._8_4_ = fVar122 * fVar111;
        fVar124 = auVar93._12_4_;
        auVar152._12_4_ = fVar124 * fVar119;
        auVar155._0_4_ = fVar43 * fVar121;
        auVar155._4_4_ = fVar17 * fVar123;
        auVar155._8_4_ = fVar11 * fVar125;
        auVar155._12_4_ = fVar16 * fVar128;
        auVar107 = vsubps_avx(auVar155,auVar152);
        auVar156._0_4_ = fVar126 * fVar121;
        auVar156._4_4_ = fVar129 * fVar123;
        auVar156._8_4_ = fVar130 * fVar125;
        auVar156._12_4_ = fVar131 * fVar128;
        auVar82._0_4_ = fVar18 * fVar112;
        auVar82._4_4_ = fVar19 * fVar120;
        auVar82._8_4_ = fVar96 * fVar122;
        auVar82._12_4_ = fVar103 * fVar124;
        auVar108 = vsubps_avx(auVar82,auVar156);
        local_19c8 = auVar88._0_4_;
        fStack_19c4 = auVar88._4_4_;
        fStack_19c0 = auVar88._8_4_;
        fStack_19bc = auVar88._12_4_;
        auVar136._0_4_ = local_19c8 * fVar121 + fVar18 * auVar92._0_4_ + auVar97._0_4_ * fVar104;
        auVar136._4_4_ = fStack_19c4 * fVar123 + fVar19 * auVar92._4_4_ + auVar97._4_4_ * fVar105;
        auVar136._8_4_ = fStack_19c0 * fVar125 + fVar96 * auVar92._8_4_ + auVar97._8_4_ * fVar111;
        auVar136._12_4_ =
             fStack_19bc * fVar128 + fVar103 * auVar92._12_4_ + auVar97._12_4_ * fVar119;
        auVar70._8_4_ = 0x80000000;
        auVar70._0_8_ = 0x8000000080000000;
        auVar70._12_4_ = 0x80000000;
        auVar93 = vandps_avx(auVar136,auVar70);
        uVar31 = auVar93._0_4_;
        auVar90._0_4_ =
             (float)(uVar31 ^ (uint)(auVar106._0_4_ * fVar63 +
                                    fVar140 * auVar107._0_4_ + fVar157 * auVar108._0_4_));
        uVar139 = auVar93._4_4_;
        auVar90._4_4_ =
             (float)(uVar139 ^
                    (uint)(auVar106._4_4_ * fVar138 +
                          fVar143 * auVar107._4_4_ + fVar161 * auVar108._4_4_));
        uVar142 = auVar93._8_4_;
        auVar90._8_4_ =
             (float)(uVar142 ^
                    (uint)(auVar106._8_4_ * fVar9 +
                          fVar145 * auVar107._8_4_ + fVar162 * auVar108._8_4_));
        uVar144 = auVar93._12_4_;
        auVar90._12_4_ =
             (float)(uVar144 ^
                    (uint)(auVar106._12_4_ * fVar14 +
                          fVar147 * auVar107._12_4_ + fVar163 * auVar108._12_4_));
        auVar118 = vcmpps_avx(auVar90,_DAT_01feba10,5);
        auVar113 = auVar50 & auVar118;
        _local_1988 = auVar59;
        if ((((auVar113 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar113 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar113 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            -1 < auVar113[0xf]) {
          auVar93 = vpcmpeqd_avx(auVar93,auVar93);
        }
        else {
          auVar118 = vandps_avx(auVar118,auVar50);
          auVar95._0_4_ =
               (float)(uVar31 ^ (uint)(auVar106._0_4_ * fVar110 +
                                      auVar107._0_4_ * fVar61 + fVar62 * auVar108._0_4_));
          auVar95._4_4_ =
               (float)(uVar139 ^
                      (uint)(auVar106._4_4_ * fVar64 +
                            auVar107._4_4_ * fVar2 + fVar3 * auVar108._4_4_));
          auVar95._8_4_ =
               (float)(uVar142 ^
                      (uint)(auVar106._8_4_ * fVar10 +
                            auVar107._8_4_ * fVar7 + fVar8 * auVar108._8_4_));
          auVar95._12_4_ =
               (float)(uVar144 ^
                      (uint)(auVar106._12_4_ * fVar15 +
                            auVar107._12_4_ * fVar12 + fVar13 * auVar108._12_4_));
          auVar59 = vcmpps_avx(auVar95,_DAT_01feba10,5);
          auVar106 = auVar118 & auVar59;
          if ((((auVar106 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar106 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar106 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar106[0xf]) {
            auVar93 = vpcmpeqd_avx(auVar93,auVar93);
          }
          else {
            auVar53._8_4_ = 0x7fffffff;
            auVar53._0_8_ = 0x7fffffff7fffffff;
            auVar53._12_4_ = 0x7fffffff;
            auVar106 = vandps_avx(auVar136,auVar53);
            auVar118 = vandps_avx(auVar59,auVar118);
            auVar59 = vsubps_avx(auVar106,auVar90);
            auVar59 = vcmpps_avx(auVar59,auVar95,5);
            auVar107 = auVar118 & auVar59;
            if ((((auVar107 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar107 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar107 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar107[0xf] < '\0') {
              auVar118 = vandps_avx(auVar59,auVar118);
              auVar101._0_4_ =
                   (float)(uVar31 ^ (uint)(local_19c8 * fVar112 +
                                          fVar126 * auVar92._0_4_ + fVar43 * auVar97._0_4_));
              auVar101._4_4_ =
                   (float)(uVar139 ^
                          (uint)(fStack_19c4 * fVar120 +
                                fVar129 * auVar92._4_4_ + fVar17 * auVar97._4_4_));
              auVar101._8_4_ =
                   (float)(uVar142 ^
                          (uint)(fStack_19c0 * fVar122 +
                                fVar130 * auVar92._8_4_ + fVar11 * auVar97._8_4_));
              auVar101._12_4_ =
                   (float)(uVar144 ^
                          (uint)(fStack_19bc * fVar124 +
                                fVar131 * auVar92._12_4_ + fVar16 * auVar97._12_4_));
              fVar61 = auVar106._0_4_;
              auVar55._0_4_ = fVar61 * *(float *)(ray + 0x30);
              fVar62 = auVar106._4_4_;
              auVar55._4_4_ = fVar62 * *(float *)(ray + 0x34);
              fVar63 = auVar106._8_4_;
              auVar55._8_4_ = fVar63 * *(float *)(ray + 0x38);
              fVar110 = auVar106._12_4_;
              auVar55._12_4_ = fVar110 * *(float *)(ray + 0x3c);
              auVar59 = vcmpps_avx(auVar55,auVar101,1);
              _local_1988 = *(undefined1 (*) [16])(ray + 0x80);
              auVar73._0_4_ = fVar61 * *(float *)(ray + 0x80);
              auVar73._4_4_ = fVar62 * *(float *)(ray + 0x84);
              auVar73._8_4_ = fVar63 * *(float *)(ray + 0x88);
              auVar73._12_4_ = fVar110 * *(float *)(ray + 0x8c);
              auVar107 = vcmpps_avx(auVar101,auVar73,2);
              auVar59 = vandps_avx(auVar107,auVar59);
              auVar107 = auVar118 & auVar59;
              if ((((auVar107 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar107 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar107 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar107[0xf] < '\0') {
                auVar118 = vandps_avx(auVar118,auVar59);
                auVar59 = vcmpps_avx(auVar136,_DAT_01feba10,4);
                auVar107 = auVar118 & auVar59;
                if ((((auVar107 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar107 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar107 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar107[0xf] < '\0') {
                  auVar118 = vandps_avx(auVar59,auVar118);
                  uVar139 = *(uint *)(lVar40 + uVar36 * 4);
                  pGVar4 = (context->scene->geometries).items[uVar139].ptr;
                  uVar31 = pGVar4->mask;
                  auVar56._4_4_ = uVar31;
                  auVar56._0_4_ = uVar31;
                  auVar56._8_4_ = uVar31;
                  auVar56._12_4_ = uVar31;
                  auVar59 = vandps_avx(auVar56,*(undefined1 (*) [16])(ray + 0x90));
                  auVar59 = vpcmpeqd_avx(auVar59,_DAT_01feba10);
                  auVar107 = auVar118 & ~auVar59;
                  if ((((auVar107 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar107 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar107 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar107[0xf] < '\0') {
                    auVar118 = vandnps_avx(auVar59,auVar118);
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar59 = vrcpps_avx(auVar106);
                      fVar43 = auVar59._0_4_;
                      auVar74._0_4_ = fVar61 * fVar43;
                      fVar61 = auVar59._4_4_;
                      auVar74._4_4_ = fVar62 * fVar61;
                      fVar62 = auVar59._8_4_;
                      auVar74._8_4_ = fVar63 * fVar62;
                      fVar63 = auVar59._12_4_;
                      auVar74._12_4_ = fVar110 * fVar63;
                      auVar109._8_4_ = 0x3f800000;
                      auVar109._0_8_ = &DAT_3f8000003f800000;
                      auVar109._12_4_ = 0x3f800000;
                      auVar59 = vsubps_avx(auVar109,auVar74);
                      fVar43 = fVar43 + fVar43 * auVar59._0_4_;
                      fVar61 = fVar61 + fVar61 * auVar59._4_4_;
                      fVar62 = fVar62 + fVar62 * auVar59._8_4_;
                      fVar63 = fVar63 + fVar63 * auVar59._12_4_;
                      auVar75._0_4_ = fVar43 * auVar90._0_4_;
                      auVar75._4_4_ = fVar61 * auVar90._4_4_;
                      auVar75._8_4_ = fVar62 * auVar90._8_4_;
                      auVar75._12_4_ = fVar63 * auVar90._12_4_;
                      auVar59 = vminps_avx(auVar75,auVar109);
                      auVar84._0_4_ = fVar43 * auVar95._0_4_;
                      auVar84._4_4_ = fVar61 * auVar95._4_4_;
                      auVar84._8_4_ = fVar62 * auVar95._8_4_;
                      auVar84._12_4_ = fVar63 * auVar95._12_4_;
                      auVar106 = vminps_avx(auVar84,auVar109);
                      auVar107 = vsubps_avx(auVar109,auVar59);
                      auVar108 = vsubps_avx(auVar109,auVar106);
                      local_1888 = vblendvps_avx(auVar59,auVar107,auVar6);
                      local_1878 = vblendvps_avx(auVar106,auVar108,auVar6);
                      local_1858 = vpshufd_avx(ZEXT416(uVar139),0);
                      local_1868 = vpshufd_avx(ZEXT416(*(uint *)((long)&local_18c8 + uVar36 * 4)),0)
                      ;
                      local_18b8[0] = (RTCHitN)auVar88[0];
                      local_18b8[1] = (RTCHitN)auVar88[1];
                      local_18b8[2] = (RTCHitN)auVar88[2];
                      local_18b8[3] = (RTCHitN)auVar88[3];
                      local_18b8[4] = (RTCHitN)auVar88[4];
                      local_18b8[5] = (RTCHitN)auVar88[5];
                      local_18b8[6] = (RTCHitN)auVar88[6];
                      local_18b8[7] = (RTCHitN)auVar88[7];
                      local_18b8[8] = (RTCHitN)auVar88[8];
                      local_18b8[9] = (RTCHitN)auVar88[9];
                      local_18b8[10] = (RTCHitN)auVar88[10];
                      local_18b8[0xb] = (RTCHitN)auVar88[0xb];
                      local_18b8[0xc] = (RTCHitN)auVar88[0xc];
                      local_18b8[0xd] = (RTCHitN)auVar88[0xd];
                      local_18b8[0xe] = (RTCHitN)auVar88[0xe];
                      local_18b8[0xf] = (RTCHitN)auVar88[0xf];
                      local_18a8 = auVar92;
                      local_1898 = auVar97;
                      auVar58._0_4_ = fVar43 * auVar101._0_4_;
                      auVar58._4_4_ = fVar61 * auVar101._4_4_;
                      auVar58._8_4_ = fVar62 * auVar101._8_4_;
                      auVar58._12_4_ = fVar63 * auVar101._12_4_;
                      vcmpps_avx(ZEXT1632(local_1888),ZEXT1632(local_1888),0xf);
                      uStack_1844 = context->user->instID[0];
                      local_1848 = uStack_1844;
                      uStack_1840 = uStack_1844;
                      uStack_183c = uStack_1844;
                      uStack_1838 = context->user->instPrimID[0];
                      uStack_1834 = uStack_1838;
                      uStack_1830 = uStack_1838;
                      uStack_182c = uStack_1838;
                      auVar59 = vblendvps_avx(_local_1988,auVar58,auVar118);
                      *(undefined1 (*) [16])(ray + 0x80) = auVar59;
                      args.valid = (int *)local_19a8;
                      args.geometryUserPtr = pGVar4->userPtr;
                      args.context = context->user;
                      args.hit = local_18b8;
                      args.N = 4;
                      local_19a8 = auVar118;
                      args.ray = (RTCRayN *)ray;
                      if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar4->occlusionFilterN)(&args);
                      }
                      if (local_19a8 == (undefined1  [16])0x0) {
                        auVar118 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                        auVar118 = auVar118 ^ _DAT_01febe20;
                      }
                      else {
                        p_Var5 = context->args->filter;
                        if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var5)(&args);
                        }
                        auVar59 = vpcmpeqd_avx((undefined1  [16])0x0,local_19a8);
                        auVar118 = auVar59 ^ _DAT_01febe20;
                        auVar85._8_4_ = 0xff800000;
                        auVar85._0_8_ = 0xff800000ff800000;
                        auVar85._12_4_ = 0xff800000;
                        auVar59 = vblendvps_avx(auVar85,*(undefined1 (*) [16])(args.ray + 0x80),
                                                auVar59);
                        *(undefined1 (*) [16])(args.ray + 0x80) = auVar59;
                      }
                      auVar59 = vpslld_avx(auVar118,0x1f);
                      auVar118 = vpsrad_avx(auVar59,0x1f);
                      auVar59 = vblendvps_avx(_local_1988,*(undefined1 (*) [16])local_1990,auVar59);
                      *(undefined1 (*) [16])local_1990 = auVar59;
                    }
                    auVar50 = vpandn_avx(auVar118,auVar50);
                    auVar93 = vpcmpeqd_avx(auVar93,auVar93);
                    goto LAB_00321b6f;
                  }
                }
              }
            }
            auVar93 = vpcmpeqd_avx(auVar93,auVar93);
          }
        }
LAB_00321b6f:
        auVar150 = ZEXT1664(auVar50);
        bVar42 = (((auVar50 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                  (auVar50 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar50 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 auVar50[0xf] < '\0';
      }
      auVar141 = ZEXT1664(auVar93);
      auVar137 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      auVar50 = auVar150._0_16_;
      if ((!bVar42) || (bVar42 = 2 < uVar36, uVar36 = uVar36 + 1, bVar42)) break;
    }
    auVar93 = vpand_avx(auVar50,auVar87);
    auVar87 = auVar87 & auVar50;
    if ((((auVar87 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar87 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar87 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar87[0xf])
    break;
  }
  aVar60 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar141._0_16_ ^ auVar93);
LAB_003223fa:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vpor_avx((undefined1  [16])aVar60,(undefined1  [16])terminated.field_0);
  auVar87 = auVar141._0_16_ & ~(undefined1  [16])terminated.field_0;
  if ((((auVar87 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar87 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar87 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar87[0xf]) {
LAB_00322438:
    iVar32 = 3;
  }
  else {
    auVar86._8_4_ = 0xff800000;
    auVar86._0_8_ = 0xff800000ff800000;
    auVar86._12_4_ = 0xff800000;
    tray.tfar.field_0 =
         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
         vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar86,
                       (undefined1  [16])terminated.field_0);
    iVar32 = 0;
  }
LAB_0032243b:
  if (iVar32 == 3) {
    auVar6 = vandps_avx(auVar76,(undefined1  [16])terminated.field_0);
    auVar76._8_4_ = 0xff800000;
    auVar76._0_8_ = 0xff800000ff800000;
    auVar76._12_4_ = 0xff800000;
    auVar6 = vmaskmovps_avx(auVar6,auVar76);
    *(undefined1 (*) [16])local_1990 = auVar6;
    return;
  }
  goto LAB_003215a8;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }